

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O1

Clause * __thiscall Inferences::URResolution::Item::generateClause(Item *this)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  UnitList *pUVar4;
  Literal *l;
  Clause *pCVar5;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *extraout_RDX;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *extraout_RDX_00;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *extraout_RDX_01;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *extraout_RDX_02;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *i;
  VirtualIterator<Kernel::Literal_*> VVar6;
  Literal *pLVar7;
  ulong uVar8;
  LiteralIterator it;
  Inference inf;
  IteratorCore<Kernel::Literal_*> *local_b8;
  VirtualIterator<Kernel::Literal_*> local_b0;
  FixedSizeAllocator<16UL> *local_a8;
  GeneratingInferenceMany local_a0;
  Literal *local_90;
  IteratorCore<Kernel::Literal_*> *local_88;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
  local_80;
  Inference local_60;
  
  pCVar5 = this->_orig;
  local_a8 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
  local_a0.premises =
       (UnitList *)
       ::Lib::FixedSizeAllocator<16UL>::alloc
                 ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  (local_a0.premises)->_head = &pCVar5->super_Unit;
  (local_a0.premises)->_tail = (List<Kernel::Unit_*> *)0x0;
  uVar3 = (ulong)((long)(this->_lits)._cursor - (long)(this->_lits)._stack) >> 3;
  if ((int)uVar3 == 0) {
    l = (Literal *)0x0;
  }
  else {
    uVar8 = 0;
    pLVar7 = (Literal *)0x0;
    do {
      l = (this->_lits)._stack[uVar8];
      if (l == (Literal *)0x0) {
        pCVar5 = (this->_premises)._array[uVar8];
        pUVar4 = (UnitList *)::Lib::FixedSizeAllocator<16UL>::alloc(local_a8);
        pUVar4->_head = &pCVar5->super_Unit;
        pUVar4->_tail = local_a0.premises;
        local_a0.premises = pUVar4;
        l = pLVar7;
      }
      uVar8 = uVar8 + 1;
      pLVar7 = l;
    } while ((uVar3 & 0xffffffff) != uVar8);
  }
  local_a0.rule = UNIT_RESULTING_RESOLUTION;
  Kernel::Inference::Inference(&local_60,&local_a0);
  pLVar7 = this->_ansLit;
  if (pLVar7 == (Literal *)0x0) {
    ::Lib::VirtualIterator<Kernel::Literal_*>::getEmpty();
  }
  else {
    local_b8 = (IteratorCore<Kernel::Literal_*> *)
               ::Lib::FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
    local_b8->_refCnt = 0;
    local_b8->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b66d98;
    *(undefined1 *)&local_b8[1]._vptr_IteratorCore = 0;
    *(Literal **)&local_b8[1]._refCnt = pLVar7;
    local_b8->_refCnt = 1;
  }
  if (l == (Literal *)0x0) {
    local_b0._core = local_b8;
    if (local_b8 != (IteratorCore<Kernel::Literal_*> *)0x0) {
      local_b8->_refCnt = local_b8->_refCnt + 1;
    }
    pCVar5 = Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>
                       (&local_b0,&local_60);
    VVar6._core = local_b0._core;
  }
  else {
    if ((&this->_ansLit->super_Term == (Term *)0x0) ||
       (uVar2 = Kernel::Term::numVarOccs(&this->_ansLit->super_Term), i = extraout_RDX, uVar2 == 0))
    {
      l = Kernel::Renaming::normalize(l);
      i = extraout_RDX_00;
    }
    if (local_b8 != (IteratorCore<Kernel::Literal_*> *)0x0) {
      local_b8->_refCnt = local_b8->_refCnt + 1;
      piVar1 = &local_b8->_refCnt;
      *piVar1 = *piVar1 + 3;
      if (*piVar1 == 0) {
        (*local_b8->_vptr_IteratorCore[1])(local_b8);
        i = extraout_RDX_01;
      }
      piVar1 = &local_b8->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_b8->_vptr_IteratorCore[1])(local_b8);
        i = extraout_RDX_02;
      }
    }
    local_a0.rule = GENERIC_FORMULA_CLAUSE_TRANSFORMATION;
    local_a0.premises = (UnitList *)((ulong)local_a0.premises & 0xffffffffffffff00);
    local_88 = local_b8;
    if (local_b8 != (IteratorCore<Kernel::Literal_*> *)0x0) {
      local_b8->_refCnt = local_b8->_refCnt + 1;
    }
    local_90 = l;
    ::Lib::
    iterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>
              (&local_80,(Lib *)&local_a0,i);
    if (local_88 != (IteratorCore<Kernel::Literal_*> *)0x0) {
      piVar1 = &local_88->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_88->_vptr_IteratorCore[1])();
      }
    }
    if (local_b8 != (IteratorCore<Kernel::Literal_*> *)0x0) {
      piVar1 = &local_b8->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_b8->_vptr_IteratorCore[1])(local_b8);
      }
      piVar1 = &local_b8->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_b8->_vptr_IteratorCore[1])(local_b8);
      }
    }
    pCVar5 = Kernel::Clause::
             fromIterator<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>>
                       (&local_80,&local_60);
    VVar6._core = local_b8;
    if (local_80._iter._it2._iter._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
      piVar1 = (int *)((long)local_80._iter._it2._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)local_80._iter._it2._iter._core + 8))();
      }
    }
  }
  if (VVar6._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = &(VVar6._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(VVar6._core)->_vptr_IteratorCore[1])(VVar6._core);
    }
  }
  if (local_b8 != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = &local_b8->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*local_b8->_vptr_IteratorCore[1])();
    }
  }
  return pCVar5;
}

Assistant:

Clause* generateClause() const
  {
    UnitList* premLst = 0;
    UnitList::push(_orig, premLst);
    Literal* single = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      if(_lits[i]!=0) {
        ASS_EQ(single,0);
        ASS_EQ(_premises[i],0);
        single = _lits[i];
      }
      else {
        Clause* premise = _premises[i];
        ASS(premise);
        UnitList::push(premise, premLst);
      }
    }

    Inference inf(GeneratingInferenceMany(InferenceRule::UNIT_RESULTING_RESOLUTION, premLst));
    Clause* res;

    LiteralIterator it = _ansLit ? pvi(getSingletonIterator(_ansLit)) : LiteralIterator::getEmpty();
    if(single) {
      if (!_ansLit || _ansLit->ground()) {
        single = Renaming::normalize(single);
      }
      res = Clause::fromIterator(concatIters(getSingletonIterator(single), it), inf);
    }
    else {
      res = Clause::fromIterator(it, inf);
    }
    return res;
  }